

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<Job,_std::shared_ptr<Job>_> * __thiscall
pybind11::class_<Job,std::shared_ptr<Job>>::def_property<std::__cxx11::string(Job::*)()const>
          (class_<Job,std::shared_ptr<Job>> *this,char *name,offset_in_Job_to_subr *fget,
          cpp_function *fset)

{
  class_<Job,_std::shared_ptr<Job>_> *pcVar1;
  return_value_policy local_41;
  offset_in_Job_to_subr local_40;
  offset_in_Job_to_subr local_38;
  cpp_function local_30;
  cpp_function *local_28;
  cpp_function *fset_local;
  offset_in_Job_to_subr *fget_local;
  char *name_local;
  class_<Job,_std::shared_ptr<Job>_> *this_local;
  
  local_40 = *fget;
  local_38 = fget[1];
  local_28 = fset;
  fset_local = (cpp_function *)fget;
  fget_local = (offset_in_Job_to_subr *)name;
  name_local = (char *)this;
  cpp_function::cpp_function<std::__cxx11::string,Job>(&local_30,local_40);
  local_41 = reference_internal;
  pcVar1 = class_<Job,_std::shared_ptr<Job>_>::def_property<pybind11::return_value_policy>
                     ((class_<Job,_std::shared_ptr<Job>_> *)this,name,&local_30,local_28,&local_41);
  cpp_function::~cpp_function(&local_30);
  return pcVar1;
}

Assistant:

class_ &def_property(const char *name, const Getter &fget, const cpp_function &fset, const Extra& ...extra) {
        return def_property(name, cpp_function(fget), fset, return_value_policy::reference_internal, extra...);
    }